

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

double fcss(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *__dest;
  void *__dest_00;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  
  uVar1 = *params;
  lVar13 = (long)(int)uVar1;
  uVar2 = *(uint *)((long)params + 8);
  uVar3 = *(uint *)((long)params + 0x18);
  __dest = malloc(lVar13 * 8);
  __dest_00 = malloc((long)(int)uVar2 * 8);
  uVar12 = (ulong)uVar1;
  if (0 < lVar13) {
    memcpy(__dest,b,uVar12 * 8);
  }
  if (0 < (int)uVar2) {
    memcpy(__dest_00,b + lVar13,(long)(int)uVar2 * 8);
  }
  if (0 < (int)uVar1) {
    memset((void *)((long)params + (long)(int)uVar3 * 8 + 0x680),0,uVar12 * 8);
  }
  if (0 < (int)uVar3 && *(int *)((long)params + 0x1c) == 1) {
    uVar7 = 0;
    do {
      *(double *)((long)params + uVar7 * 8 + 0x680) =
           *(double *)((long)params + uVar7 * 8 + (ulong)uVar3 * 0x10 + 0x680) -
           b[(int)(uVar2 + uVar1)];
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  dVar15 = 0.0;
  dVar14 = 0.0;
  if ((int)uVar1 < (int)uVar3) {
    lVar5 = (lVar13 << 0x20) + -0x100000000;
    iVar9 = uVar3 + uVar1 + -1;
    uVar10 = 0;
    do {
      uVar4 = uVar10;
      if ((int)uVar2 < (int)uVar10) {
        uVar4 = uVar2;
      }
      dVar15 = *(double *)((long)params + lVar13 * 8 + 0x680);
      if (0 < (int)uVar1) {
        uVar7 = 0;
        lVar8 = lVar5;
        do {
          dVar15 = dVar15 - *(double *)((long)__dest + uVar7 * 8) *
                            *(double *)((long)params + (lVar8 >> 0x1d) + 0x680);
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + -0x100000000;
        } while (uVar12 != uVar7);
      }
      uVar6 = (int)lVar13 - uVar1;
      if ((int)uVar2 <= (int)uVar6) {
        uVar6 = uVar2;
      }
      if (0 < (int)uVar6) {
        uVar7 = 0;
        iVar11 = iVar9;
        do {
          dVar15 = dVar15 - *(double *)((long)__dest_00 + uVar7 * 8) *
                            *(double *)((long)params + (long)iVar11 * 8 + 0x680);
          uVar7 = uVar7 + 1;
          iVar11 = iVar11 + -1;
        } while (uVar4 != uVar7);
      }
      uVar10 = uVar10 + 1;
      *(double *)((long)params + ((int)uVar3 + lVar13) * 8 + 0x680) = dVar15;
      dVar14 = dVar14 + dVar15 * dVar15;
      lVar13 = lVar13 + 1;
      lVar5 = lVar5 + 0x100000000;
      iVar9 = iVar9 + 1;
    } while (uVar10 != uVar3 - uVar1);
    dVar15 = (double)(int)(uVar3 - uVar1);
  }
  *(double *)((long)params + 0x30) = dVar14;
  dVar14 = log(dVar14 / dVar15);
  *(double *)((long)params + 0x38) = dVar14 * 0.5;
  free(__dest);
  free(__dest_00);
  return dVar14 * 0.5;
}

Assistant:

double fcss(double *b, int pq, void *params) {
	double value,ssq,temp;
	int ip, iq, N,i,ncond,j,jm,iter;
	double *phi, *theta;
	alik_css_object obj = (alik_css_object)params;

	ip = obj->p;
	iq = obj->q;

	N = obj->N;

	value = ssq = 0.0;
	ncond = ip;
	iter = 0;
	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);

	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i + ip];
	}

	for (i = 0; i < ncond; ++i) {
		obj->x[N + i] = 0.0;
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip+iq];
		}
	}

	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[i];

		for (j = 0; j < ip; ++j) {
			temp = temp -  phi[j] * obj->x[i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[N + i - j - 1];
		}

		obj->x[N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	free(phi);
	free(theta);
	return value;
}